

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.c
# Opt level: O1

int32 read_bbi_list(FILE *fp,kd_tree_node_t *node,int32 maxbbi)

{
  int32 iVar1;
  int iVar2;
  uint8 *__dest;
  char *fmt;
  long lVar3;
  int32 iVar4;
  uint uVar5;
  uint uVar6;
  int bbi;
  uint8 bbi_list [256];
  int local_13c;
  undefined1 local_138 [264];
  
  uVar5 = 0x100;
  if (maxbbi != -1) {
    uVar5 = maxbbi;
  }
  iVar1 = read_tree_int(fp,"bbi",&local_13c,1);
  iVar4 = -1;
  if (-1 < iVar1) {
    uVar6 = 0;
    if (1 < iVar1) {
      if (0xff < local_13c) {
        fmt = "BBI Gaussian %d out of range! %d\n";
        lVar3 = 0x67;
LAB_00111ed7:
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kdtree.c"
                ,lVar3,fmt);
        return -1;
      }
      local_138[0] = (undefined1)local_13c;
      iVar2 = __isoc99_fscanf(fp,"%d",&local_13c);
      uVar6 = 1;
      if (iVar2 != 0) {
        do {
          iVar2 = feof((FILE *)fp);
          if (iVar2 != 0) break;
          if (0xff < local_13c) {
            fmt = "BBI Gaussian %d out of range!\n";
            lVar3 = 0x70;
            goto LAB_00111ed7;
          }
          if ((int)uVar6 < (int)uVar5) {
            lVar3 = (long)(int)uVar6;
            uVar6 = uVar6 + 1;
            local_138[lVar3] = (char)local_13c;
          }
          iVar2 = __isoc99_fscanf(fp,"%d",&local_13c);
        } while (iVar2 != 0);
      }
    }
    if (node != (kd_tree_node_t *)0x0) {
      if ((int)uVar6 < (int)uVar5) {
        uVar5 = uVar6;
      }
      node->n_bbi = (uint16)uVar5;
      if (uVar5 != 0) {
        __dest = (uint8 *)__ckd_calloc__((ulong)(uVar5 & 0xffff),1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kdtree.c"
                                         ,0x7d);
        node->bbi = __dest;
        memcpy(__dest,local_138,(ulong)node->n_bbi);
      }
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int32
read_bbi_list(FILE * fp, kd_tree_node_t * node, int32 maxbbi)
{
    uint8 bbi_list[S2_NUM_ALPHABET];
    int bbi, nbbi = 0, nr;

    if (maxbbi == -1)
        maxbbi = S2_NUM_ALPHABET;
    if ((nr = read_tree_int(fp, "bbi", &bbi, TRUE)) < 0)
        return -1;
    if (nr > 1) {
        if (bbi >= S2_NUM_ALPHABET) {
            E_ERROR("BBI Gaussian %d out of range! %d\n", bbi);
            return -1;
        }
        bbi_list[0] = bbi;
        nbbi = 1;
        while (fscanf(fp, "%d", &bbi)) {
            if (feof(fp))
                break;
            if (bbi >= S2_NUM_ALPHABET) {
                E_ERROR("BBI Gaussian %d out of range!\n", bbi);
                return -1;
            }
            if (nbbi < maxbbi)
                bbi_list[nbbi++] = bbi;
        }
    }
    if (node == NULL)
        return 0;
    if (nbbi > maxbbi)
        nbbi = maxbbi;
    node->n_bbi = nbbi;
    if (nbbi) {
        node->bbi = ckd_calloc(node->n_bbi, sizeof(*node->bbi));
        memcpy(node->bbi, bbi_list, node->n_bbi * sizeof(*node->bbi));
    }
    return 0;
}